

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dense_rankValueFunc(sqlite3_context *pCtx)

{
  Mem *pMem;
  long *plVar1;
  long val;
  
  if ((pCtx->pMem->flags & 0x2000) == 0) {
    plVar1 = (long *)createAggContext(pCtx,0x18);
  }
  else {
    plVar1 = (long *)pCtx->pMem->z;
  }
  if (plVar1 != (long *)0x0) {
    val = *plVar1;
    if (plVar1[1] != 0) {
      val = val + 1;
      *plVar1 = val;
      plVar1[1] = 0;
    }
    pMem = pCtx->pOut;
    if ((pMem->flags & 0x2400) != 0) {
      vdbeReleaseAndSetInt64(pMem,val);
      return;
    }
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void dense_rankValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    if( p->nStep ){
      p->nValue++;
      p->nStep = 0;
    }
    sqlite3_result_int64(pCtx, p->nValue);
  }
}